

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.hpp
# Opt level: O2

string_view __thiscall
chain::str::trim_left_view<(chain::str::case_t)0>
          (str *this,string_view data,
          vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          *to_remove)

{
  size_t *psVar1;
  bool bVar2;
  long *plVar3;
  size_t sVar4;
  char *pcVar5;
  bool bVar6;
  size_t *psVar7;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *__range4;
  string_view sVar8;
  string_view data_00;
  string_view begin;
  
  plVar3 = (long *)data._M_str;
  pcVar5 = (char *)data._M_len;
  if (this == (str *)0x0) {
    this = (str *)0x0;
  }
  else if (*plVar3 != plVar3[1]) {
    do {
      psVar1 = (size_t *)plVar3[1];
      bVar6 = false;
      for (psVar7 = (size_t *)*plVar3; psVar7 != psVar1; psVar7 = psVar7 + 2) {
        sVar4 = *psVar7;
        while (data_00._M_str = pcVar5, data_00._M_len = (size_t)this,
              begin._M_str = (char *)psVar7[1], begin._M_len = sVar4,
              bVar2 = starts_with<(chain::str::case_t)0>(data_00,begin), bVar2) {
          sVar4 = *psVar7;
          pcVar5 = pcVar5 + sVar4;
          this = this + -sVar4;
          bVar6 = true;
        }
      }
    } while (bVar6);
  }
  sVar8._M_str = pcVar5;
  sVar8._M_len = (size_t)this;
  return sVar8;
}

Assistant:

auto trim_left_view(std::string_view data, const std::vector<std::string_view>& to_remove) -> std::string_view
{
    if (!data.empty() && !to_remove.empty())
    {
        while (true)
        {
            bool had_removal{false};

            for (const auto& remove : to_remove)
            {
                while (starts_with<case_type>(data, remove))
                {
                    data.remove_prefix(remove.size());
                    had_removal = true;
                }
            }

            if (!had_removal)
            {
                break;
            }
        }
    }

    return data;
}